

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findDeclaredFunctions.cpp
# Opt level: O2

void declareFunc(Function *func,Program *program)

{
  undefined1 uVar1;
  bool bVar2;
  IntegerType *pIVar3;
  Value *val;
  iterator_range<const_llvm::Argument_*> iVar4;
  iterator_range<const_llvm::Argument_*> iVar5;
  StringRef Prefix;
  StringRef Suffix;
  StringRef Suffix_00;
  StringRef Suffix_01;
  StringRef Suffix_02;
  StringRef Suffix_03;
  StringRef Suffix_04;
  Function *func_local;
  __single_object decl;
  _Head_base<0UL,_Expr_*,_false> local_c8;
  Program *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  StringRef local_a0;
  string local_90;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  func_local = func;
  local_c0 = program;
  local_90._M_dataplus._M_p = (pointer)program;
  uVar1 = llvm::GlobalValue::isDeclaration();
  local_b8[0] = uVar1;
  std::make_unique<Func,llvm::Function_const*&,Program*,bool>
            ((Function **)&decl,(Program **)&func_local,(bool *)&local_90);
  iVar4 = llvm::Function::args(func_local);
  for (val = (Value *)iVar4.begin_iterator; val != (Value *)iVar4.end_iterator; val = val + 0x28) {
    Func::getVarName_abi_cxx11_
              (&local_90,
               (Func *)decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
                       super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
                       super__Head_base<0UL,_Func_*,_false>._M_head_impl);
    local_a0.Data = (char *)Program::getType(local_c0,*(Type **)val);
    std::make_unique<Value,std::__cxx11::string,Type*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
               (Type **)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_c8._M_head_impl = (Expr *)local_b8._0_8_;
    local_b8._0_8_ = (long *)0x0;
    Func::createExpr((Func *)decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
                             super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
                             super__Head_base<0UL,_Func_*,_false>._M_head_impl,val,
                     (unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_c8);
    if (local_c8._M_head_impl != (Expr *)0x0) {
      (*(local_c8._M_head_impl)->_vptr_Expr[1])();
    }
    local_c8._M_head_impl = (Expr *)0x0;
    if ((long *)local_b8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  iVar4 = llvm::Function::args(func_local);
  iVar5 = llvm::Function::args(func_local);
  if (iVar4.begin_iterator != iVar5.end_iterator) {
    Func::setVarArg((Func *)decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
                            super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
                            super__Head_base<0UL,_Func_*,_false>._M_head_impl,
                    0xff < *(uint *)(*(long *)(func_local + 0x18) + 8));
  }
  local_90._0_16_ = llvm::Value::getName();
  Prefix.Length = 0x12;
  Prefix.Data = "__VERIFIER_nondet_";
  bVar2 = llvm::StringRef::startswith((StringRef *)&local_90,Prefix);
  if (bVar2) {
    local_b8 = llvm::Value::getName();
    Suffix.Length = 4;
    Suffix.Data = "_int";
    bVar2 = llvm::StringRef::endswith((StringRef *)local_b8,Suffix);
    if (!bVar2) {
      local_a0 = (StringRef)llvm::Value::getName();
      Suffix_00.Length = 5;
      Suffix_00.Data = "_long";
      bVar2 = llvm::StringRef::endswith(&local_a0,Suffix_00);
      if (!bVar2) {
        local_40 = (StringRef)llvm::Value::getName();
        Suffix_01.Length = 6;
        Suffix_01.Data = "_short";
        bVar2 = llvm::StringRef::endswith(&local_40,Suffix_01);
        if (!bVar2) {
          local_50 = (StringRef)llvm::Value::getName();
          Suffix_02.Length = 5;
          Suffix_02.Data = "_char";
          bVar2 = llvm::StringRef::endswith(&local_50,Suffix_02);
          if (!bVar2) {
            local_60 = (StringRef)llvm::Value::getName();
            Suffix_03.Length = 6;
            Suffix_03.Data = "_float";
            bVar2 = llvm::StringRef::endswith(&local_60,Suffix_03);
            if (!bVar2) {
              local_70 = (StringRef)llvm::Value::getName();
              Suffix_04.Length = 7;
              Suffix_04.Data = "_double";
              bVar2 = llvm::StringRef::endswith(&local_70,Suffix_04);
              if (!bVar2) goto LAB_0016e6d0;
            }
          }
        }
      }
    }
    pIVar3 = TypeHandler::setSigned
                       (&local_c0->typeHandler,
                        *(IntegerType **)
                         decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
                         super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
                         super__Head_base<0UL,_Func_*,_false>._M_head_impl);
    *(IntegerType **)
     decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
     super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.super__Head_base<0UL,_Func_*,_false>
     ._M_head_impl = pIVar3;
  }
LAB_0016e6d0:
  local_a8 = (undefined1  [8])
             decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
             super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
             super__Head_base<0UL,_Func_*,_false>._M_head_impl;
  decl._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
  super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.super__Head_base<0UL,_Func_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Func,_std::default_delete<Func>,_true,_true>)
                 (__uniq_ptr_impl<Func,_std::default_delete<Func>_>)0x0;
  Program::addFunction(local_c0,func_local,(unique_ptr<Func,_std::default_delete<Func>_> *)local_a8)
  ;
  std::unique_ptr<Func,_std::default_delete<Func>_>::~unique_ptr
            ((unique_ptr<Func,_std::default_delete<Func>_> *)local_a8);
  std::unique_ptr<Func,_std::default_delete<Func>_>::~unique_ptr(&decl);
  return;
}

Assistant:

static void declareFunc(const llvm::Function* func, Program& program) {
    auto decl = std::make_unique<Func>(func, &program, func->isDeclaration());
    for (const llvm::Value& arg : func->args()) {
        auto argVal = std::make_unique<Value>(decl->getVarName(), program.getType(arg.getType()));
        decl->createExpr(&arg, std::move(argVal));
    }

    if (func->args().begin() != func->args().end()) {
        decl->setVarArg(func->isVarArg());
    }

    // FIXME: a hack for CPAchecker -- do this optional
    if (func->getName().startswith("__VERIFIER_nondet_") &&
        (func->getName().endswith("_int") || 
         func->getName().endswith("_long") || 
         func->getName().endswith("_short") || 
         func->getName().endswith("_char") || 
         func->getName().endswith("_float") ||
         func->getName().endswith("_double"))) {
        decl->returnType = program.typeHandler.setSigned(static_cast<IntegerType*>(decl->returnType));
    }
    program.addFunction(func, std::move(decl));
}